

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O0

void __thiscall trun::ResultsReportJSON::PrintAssertError(ResultsReportJSON *this,Ref *result)

{
  element_type *peVar1;
  AssertError *pAVar2;
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  *this_00;
  size_t sVar3;
  shared_ptr<trun::TestResult> local_30;
  const_reference local_20;
  value_type *aerr;
  Ref *result_local;
  ResultsReportJSON *this_local;
  
  aerr = (value_type *)result;
  result_local = (Ref *)this;
  peVar1 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)result);
  pAVar2 = TestResult::AssertError(peVar1);
  this_00 = AssertError::Errors(pAVar2);
  local_20 = std::
             vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
             ::front(this_00);
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"IsAssertValid\" : true,");
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Assert\" : {");
  PrintAssert(this,local_20);
  peVar1 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)result);
  pAVar2 = TestResult::AssertError(peVar1);
  sVar3 = AssertError::NumErrors(pAVar2);
  if (sVar3 < 2) {
    ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"}");
  }
  else {
    ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"},");
    std::shared_ptr<trun::TestResult>::shared_ptr(&local_30,result);
    PrintAssertArray(this,&local_30);
    std::shared_ptr<trun::TestResult>::~shared_ptr(&local_30);
  }
  return;
}

Assistant:

void ResultsReportJSON::PrintAssertError(const TestResult::Ref result) {
    auto &aerr = result->AssertError().Errors().front();

    WriteLine(R"("IsAssertValid" : true,)");
    // Up to v2.0.0 we only had this
    WriteLine(R"("Assert" : {)");
    PrintAssert(aerr);
    // This array is new from v2.1.0
    if (result->AssertError().NumErrors() > 1) {
        WriteLine("},");
        // NOTE: this is assumed to be last item in the parent object...
        PrintAssertArray(result);
    } else {
        WriteLine("}");
    }
}